

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scoped_ptr.h
# Opt level: O3

void __thiscall
google::protobuf::internal::scoped_ptr<google::protobuf::UnknownFieldSet>::reset
          (scoped_ptr<google::protobuf::UnknownFieldSet> *this,UnknownFieldSet *p)

{
  UnknownFieldSet *this_00;
  
  this_00 = this->ptr_;
  if (this_00 != p) {
    if ((this_00 != (UnknownFieldSet *)0x0) &&
       (this_00->fields_ !=
        (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)
        0x0)) {
      UnknownFieldSet::ClearFallback(this_00);
    }
    operator_delete(this_00,8);
    this->ptr_ = p;
  }
  return;
}

Assistant:

void reset(C* p = NULL) {
    if (p != ptr_) {
      enum { type_must_be_complete = sizeof(C) };
      delete ptr_;
      ptr_ = p;
    }
  }